

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int GetColorPalette(WebPPicture *pic,uint32_t *palette)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t in_use [1024];
  uint32_t colors [1024];
  
  uVar10 = 0;
  memset(in_use,0,0x400);
  memset(colors,0,0x1000);
  puVar2 = pic->argb;
  uVar8 = ~*puVar2;
  uVar4 = (ulong)(uint)pic->width;
  if (pic->width < 1) {
    uVar4 = uVar10;
  }
  iVar5 = pic->height;
  if (pic->height < 1) {
    iVar5 = 0;
  }
  iVar6 = 0;
  do {
    if ((int)uVar10 == iVar5) {
      if (palette != (uint32_t *)0x0) {
        iVar6 = 0;
        for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
          if (in_use[lVar3] != '\0') {
            palette[iVar6] = colors[lVar3];
            iVar6 = iVar6 + 1;
          }
        }
        qsort(palette,(long)iVar6,4,PaletteCompareColorsForQsort);
      }
      return iVar6;
    }
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      uVar1 = puVar2[uVar7];
      if (uVar1 != uVar8) {
        for (uVar9 = uVar1 * 0x1e35a7bd >> 0x16; uVar8 = uVar1, in_use[uVar9] != '\0';
            uVar9 = uVar9 + 1 & 0x3ff) {
          if (colors[uVar9] == uVar1) goto LAB_0013362a;
        }
        colors[uVar9] = uVar1;
        in_use[uVar9] = '\x01';
        if (0xff < iVar6) {
          return 0x101;
        }
        iVar6 = iVar6 + 1;
      }
LAB_0013362a:
    }
    puVar2 = puVar2 + pic->argb_stride;
    uVar10 = (ulong)((int)uVar10 + 1);
  } while( true );
}

Assistant:

int GetColorPalette(const WebPPicture* const pic, uint32_t* const palette) {
  int i;
  int x, y;
  int num_colors = 0;
  uint8_t in_use[COLOR_HASH_SIZE] = {0};
  uint32_t colors[COLOR_HASH_SIZE] = {0};
  const uint32_t* argb = pic->argb;
  const int width = pic->width;
  const int height = pic->height;
  uint32_t last_pix = ~argb[0];  // so we're sure that last_pix != argb[0]
  assert(pic != NULL);
  assert(pic->use_argb);

  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      int key;
      if (argb[x] == last_pix) {
        continue;
      }
      last_pix = argb[x];
      key = VP8LHashPix(last_pix, COLOR_HASH_RIGHT_SHIFT);
      while (1) {
        if (!in_use[key]) {
          colors[key] = last_pix;
          in_use[key] = 1;
          ++num_colors;
          if (num_colors > MAX_PALETTE_SIZE) {
            return MAX_PALETTE_SIZE + 1;  // Exact count not needed.
          }
          break;
        } else if (colors[key] == last_pix) {
          break;  // The color is already there.
        } else {
          // Some other color sits here, so do linear conflict resolution.
          ++key;
          key &= (COLOR_HASH_SIZE - 1);  // Key mask.
        }
      }
    }
    argb += pic->argb_stride;
  }

  if (palette != NULL) {  // Fill the colors into palette.
    num_colors = 0;
    for (i = 0; i < COLOR_HASH_SIZE; ++i) {
      if (in_use[i]) {
        palette[num_colors] = colors[i];
        ++num_colors;
      }
    }
    qsort(palette, num_colors, sizeof(*palette), PaletteCompareColorsForQsort);
  }
  return num_colors;
}